

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderDrawCallsWhileTFPaused::iterate(GeometryShaderDrawCallsWhileTFPaused *this)

{
  ostringstream *poVar1;
  GeometryShaderDrawCallsWhileTFPaused *pGVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  deUint32 dVar6;
  GLuint GVar7;
  long lVar8;
  undefined4 extraout_var;
  string *psVar9;
  NotSupportedError *this_00;
  undefined1 *puVar10;
  char *description;
  GeometryShaderDrawCallsWhileTFPaused *pGVar11;
  ulong uVar12;
  GLuint *pGVar13;
  long lVar14;
  bool has_shader_compilation_failed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5d0;
  GeometryShaderDrawCallsWhileTFPaused *local_5c8;
  string *local_5c0;
  GLuint *local_5b8;
  char *gs_code_specialized_raw;
  char *gs_code;
  char *vs_code_specialized_raw;
  string fs_code_specialized;
  string gs_code_specialized;
  string vs_code_specialized;
  char *fs_code_specialized_raw;
  char *tf_varyings [1];
  string gs_max_output_vertices [3];
  string gs_outputs [3];
  string gs_inputs [5];
  undefined1 local_398 [368];
  undefined8 auStack_228 [2];
  string gs_codes [15];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)gs_inputs,"points",(allocator<char> *)gs_codes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs + 1),"lines",(allocator<char> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs + 2),"lines_adjacency",(allocator<char> *)gs_outputs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs + 3),"triangles",(allocator<char> *)gs_max_output_vertices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs + 4),"triangles_adjacency",(allocator<char> *)&fs_code_specialized
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)gs_outputs,"points",(allocator<char> *)gs_codes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_outputs + 1),"line_strip",(allocator<char> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_outputs + 2),"triangle_strip",(allocator<char> *)gs_max_output_vertices);
  local_5c0 = gs_codes;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)gs_max_output_vertices,"1",(allocator<char> *)local_5c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_max_output_vertices + 1),"2",(allocator<char> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_max_output_vertices + 2),"3",(allocator<char> *)&fs_code_specialized);
  lVar8 = 0x10;
  do {
    puVar10 = (undefined1 *)((long)&gs_codes[0]._M_dataplus._M_p + lVar8);
    *(undefined1 **)((long)auStack_228 + lVar8) = puVar10;
    *(undefined8 *)((long)auStack_228 + lVar8 + 8) = 0;
    *puVar10 = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x1f0);
  lVar8 = 0;
  local_5c8 = this;
  while (pGVar11 = local_5c8, lVar8 != 5) {
    local_5d0 = gs_inputs + lVar8;
    local_5b8 = (GLuint *)lVar8;
    for (lVar14 = 0; lVar14 != 0x60; lVar14 = lVar14 + 0x20) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fs_code_specialized_raw,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (",
                     local_5d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tf_varyings,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fs_code_specialized_raw,") in;\nlayout (");
      std::operator+(&gs_code_specialized,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tf_varyings,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&gs_outputs[0]._M_dataplus._M_p + lVar14));
      std::operator+(&vs_code_specialized,&gs_code_specialized,", max_vertices = ");
      std::operator+(&fs_code_specialized,&vs_code_specialized,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&gs_max_output_vertices[0]._M_dataplus._M_p + lVar14));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     &fs_code_specialized,
                     ") out;\n\nout vec2 out_gs_1;\n\nvoid main()\n{\n    out_gs_1    = vec2(1.0, 2.0);\n    gl_Position = vec4(0, 0, 0, 1);\n    EmitVertex();\n}\n"
                    );
      std::__cxx11::string::operator=
                ((string *)((long)&(local_5c0->_M_dataplus)._M_p + lVar14),(string *)local_398);
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::string::~string((string *)&fs_code_specialized);
      std::__cxx11::string::~string((string *)&vs_code_specialized);
      std::__cxx11::string::~string((string *)&gs_code_specialized);
      std::__cxx11::string::~string((string *)tf_varyings);
      std::__cxx11::string::~string((string *)&fs_code_specialized_raw);
    }
    local_5c0 = local_5c0 + 3;
    lVar8 = (long)local_5b8 + 1;
  }
  has_shader_compilation_failed = true;
  if ((local_5c8->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x10b3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((local_5c8->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  local_5b8 = pGVar11->m_po_ids;
  for (lVar14 = 0xae; lVar14 != 0xbd; lVar14 = lVar14 + 1) {
    uVar5 = (**(code **)(lVar8 + 0x3c8))();
    *(undefined4 *)
     ((long)&(pGVar11->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode + lVar14 * 4
     ) = uVar5;
  }
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10bd);
  tf_varyings[0] = "out_gs_1";
  for (lVar14 = 0xae; lVar14 != 0xbd; lVar14 = lVar14 + 1) {
    (**(code **)(lVar8 + 0x14c8))
              (*(undefined4 *)
                ((long)&(pGVar11->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode +
                lVar14 * 4),1,tf_varyings,0x8c8c);
  }
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10c6);
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  pGVar11->m_fs_id = GVar7;
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8dd9);
  pGVar11->m_gs_id = GVar7;
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
  pGVar11->m_vs_id = GVar7;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10cc);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&pGVar11->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&pGVar11->super_TestCaseBase,1,&dummy_vs_code);
  pGVar11 = local_5c8;
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  local_5d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_5d0._4_4_,
                       (int)CONCAT71((int7)((ulong)vs_code_specialized._M_dataplus._M_p >> 8),1));
  poVar1 = (ostringstream *)(local_398 + 8);
  for (lVar14 = 0; pGVar2 = local_5c8, lVar14 != 0x3c; lVar14 = lVar14 + 4) {
    gs_code = (&gs_codes[0]._M_dataplus)[lVar14]._M_p;
    TestCaseBase::specializeShader_abi_cxx11_
              (&gs_code_specialized,&pGVar11->super_TestCaseBase,1,&gs_code);
    gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
    bVar3 = TestCaseBase::buildProgram
                      (&pGVar11->super_TestCaseBase,*(GLuint *)((long)pGVar11->m_po_ids + lVar14),
                       pGVar11->m_fs_id,1,&fs_code_specialized_raw,pGVar11->m_gs_id,1,
                       &gs_code_specialized_raw,pGVar11->m_vs_id,1,&vs_code_specialized_raw,
                       &has_shader_compilation_failed);
    if (!bVar3) {
      local_398._0_8_ =
           ((local_5c8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Program object linking failed whereas a success was expected.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_5d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)local_5d0 & 0xffffffff00000000);
    }
    std::__cxx11::string::~string((string *)&gs_code_specialized);
  }
  pGVar11 = local_5c8;
  if (((ulong)local_5d0 & 1) != 0) {
    pGVar13 = &local_5c8->m_vao_id;
    (**(code **)(lVar8 + 0x708))(1,pGVar13);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGenVertexArrays() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10ef);
    (**(code **)(lVar8 + 0xd8))(*pGVar13);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindVertexArray() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f2);
    pGVar13 = &pGVar2->m_tfbo_id;
    (**(code **)(lVar8 + 0x6c8))(1,pGVar13);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGenBuffers() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f6);
    (**(code **)(lVar8 + 0x40))(0x8892,*pGVar13);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f9);
    (**(code **)(lVar8 + 0x150))(0x8892,0x18,0,0x88e1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBufferData() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10fe);
    (**(code **)(lVar8 + 0x48))(0x8c8e,0,*pGVar13);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBufferBase() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1101);
    (**(code **)(lVar8 + 0x5e0))(0x8c89);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glEnable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1104);
    psVar9 = (string *)0x0;
    while ((psVar9 < (string *)0x3 && (((ulong)local_5d0 & 1) != 0))) {
      uVar12 = 0;
      pGVar13 = local_5b8;
      local_5c0 = psVar9;
      while ((uVar12 < 5 && (((ulong)local_5d0 & 1) != 0))) {
        lVar14 = 0;
        do {
          if (lVar14 == 3) goto LAB_00cdc061;
          (**(code **)(lVar8 + 0x1680))(pGVar13[lVar14]);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glUseProgram() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x110e);
          (**(code **)(lVar8 + 0x30))(*(undefined4 *)(&DAT_01790a18 + (long)local_5c0 * 4));
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glBeginTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x1111);
          (**(code **)(lVar8 + 0xfe0))();
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glPauseTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x1114);
          (**(code **)(lVar8 + 0x538))((&DAT_01790a30)[uVar12],0,3);
          iVar4 = (**(code **)(lVar8 + 0x800))();
          (**(code **)(lVar8 + 0x1248))();
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glResumeTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x111a);
          (**(code **)(lVar8 + 0x638))();
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glEndTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x111d);
          lVar14 = lVar14 + 1;
        } while (iVar4 == 0);
        local_398._0_8_ =
             ((local_5c8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_398 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "glDrawArrays() call generated an error while transform feedback was paused."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        local_5d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)local_5d0 & 0xffffffff00000000);
LAB_00cdc061:
        uVar12 = uVar12 + 1;
        pGVar13 = pGVar13 + 3;
      }
      psVar9 = (string *)((long)&(local_5c0->_M_dataplus)._M_p + 1);
    }
    (**(code **)(lVar8 + 0x4e8))(0x8c89);
    pGVar11 = local_5c8;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glDisable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x112e);
  }
  description = "Fail";
  if (((ulong)local_5d0 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pGVar11->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(byte)local_5d0 & QP_TEST_RESULT_FAIL,description);
  std::__cxx11::string::~string((string *)&vs_code_specialized);
  std::__cxx11::string::~string((string *)&fs_code_specialized);
  lVar8 = 0x1c0;
  do {
    std::__cxx11::string::~string((string *)((long)&gs_codes[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  lVar8 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&gs_max_output_vertices[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  lVar8 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&gs_outputs[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  lVar8 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&gs_inputs[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderDrawCallsWhileTFPaused::iterate()
{
	/* Define 15 (all combinations of possible inputs and outputs in geometry shader) Geometry Shaders for purpose of this test. */
	const std::string gs_inputs[]  = { "points", "lines", "lines_adjacency", "triangles", "triangles_adjacency" };
	const std::string gs_outputs[] = { "points", "line_strip", "triangle_strip" };
	const std::string gs_max_output_vertices[] = { "1", "2", "3" };

	const unsigned short number_of_combinations =
		(sizeof(gs_inputs) / sizeof(gs_inputs[0]) * (sizeof(gs_outputs) / sizeof(gs_outputs[0])));

	std::string gs_codes[number_of_combinations];
	glw::GLenum errorCode;

	for (size_t i = 0; i < (sizeof(gs_inputs) / sizeof(gs_inputs[0])) /*5 possible GS inputs*/; ++i)
	{
		for (size_t j = 0; j < (sizeof(gs_outputs) / sizeof(gs_outputs[0])) /*3 possible GS outputs*/; ++j)
		{
			/* This shader will not emit primitives for anything but points.
			 * We do so, because we just need to make sure that, while transform feedback
			 * is paused, all draw calls executed with an active program object which
			 * includes a geometry shader, are valid.
			 */
			gs_codes[j + 3 * i] = "${VERSION}\n"
								  "${GEOMETRY_SHADER_REQUIRE}\n"
								  "\n"
								  "layout (" +
								  gs_inputs[i] + ") in;\n"
												 "layout (" +
								  gs_outputs[j] + ", max_vertices = " + gs_max_output_vertices[j] +
								  ") out;\n"
								  "\n"
								  "out vec2 out_gs_1;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    out_gs_1    = vec2(1.0, 2.0);\n"
								  "    gl_Position = vec4(0, 0, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n";
		}
	}

	bool			  has_shader_compilation_failed = true;
	bool			  result						= true;
	const glw::GLuint tf_modes[3]					= { GL_POINTS, GL_LINES, GL_TRIANGLES };
	const glw::GLuint draw_call_modes[5]			= { GL_POINTS, GL_LINES, GL_LINES_ADJACENCY, GL_TRIANGLES,
											 GL_TRIANGLES_ADJACENCY };

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects. */
	for (int i = 0; i < number_of_combinations; ++i)
	{
		m_po_ids[i] = gl.createProgram();
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Specify output variables to be captured. */
	const char* tf_varyings[] = { "out_gs_1" };

	for (int i = 0; i < number_of_combinations; ++i)
	{
		gl.transformFeedbackVaryings(m_po_ids[i], 1 /*count*/, tf_varyings, GL_INTERLEAVED_ATTRIBS);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call(s) failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (int i = 0; i < number_of_combinations; ++i)
	{
		const char* gs_code					= gs_codes[i].c_str();
		std::string gs_code_specialized		= specializeShader(1, &gs_code);
		const char* gs_code_specialized_raw = gs_code_specialized.c_str();

		if (!TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,			  /* n_sh1_body_parts */
										&fs_code_specialized_raw, m_gs_id, 1, /* n_sh2_body_parts */
										&gs_code_specialized_raw, m_vs_id, 1, /* n_sh3_body_parts */
										&vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Program object linking failed whereas a success was expected."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	if (!result)
	{
		goto end;
	}

	/* Create Vertex Array Object. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call(s) failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call(s) failed.");

	/* Create Buffer Object for Transform Feedback data. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call(s) failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call(s) failed.");

	gl.bufferData(GL_ARRAY_BUFFER,
				  sizeof(glw::GLfloat) * 2 * 3 /* capture 2 float vector components times 3 triangle vertices */, NULL,
				  GL_STREAM_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call(s) failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call(s) failed.");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call(s) failed.");

	for (int i = 0; i < 3 /* number of TF modes */ && result; ++i)
	{
		for (int j = 0; j < 5 /*number of draw call modes*/ && result; ++j)
		{
			for (int k = 0; k < 3 /* number of output GS primitive types */; ++k)
			{
				/* Turn on program object. */
				gl.useProgram(m_po_ids[k + 3 * j]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call(s) failed.");

				gl.beginTransformFeedback(tf_modes[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call(s) failed.");

				gl.pauseTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback() call(s) failed.");

				gl.drawArrays(draw_call_modes[j], 0 /*first*/, 3 /*count*/);
				errorCode = gl.getError();

				gl.resumeTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glResumeTransformFeedback() call(s) failed.");

				gl.endTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call(s) failed.");

				/* If draw call fails stop test execution. */
				if (GL_NO_ERROR != errorCode)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "glDrawArrays() call generated an error while transform feedback was paused."
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}
			}
		}
	}

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call(s) failed.");

end:

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}